

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-split.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
stringsplitter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iter::operator*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *__return_storage_ptr__,iter *this)

{
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  iter *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  iter *local_18;
  iter *this_local;
  
  local_28 = (this->p)._M_current;
  local_30 = (this->last)._M_current;
  local_38 = this;
  local_18 = this;
  this_local = (iter *)__return_storage_ptr__;
  local_20 = (char *)std::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_28,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_30,(anon_class_8_1_8991fb9c_for__M_pred)this);
  (this->q)._M_current = local_20;
  local_40._M_current = (this->p)._M_current;
  local_48._M_current = (this->q)._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

S operator*()
        {
            //q = std::find_first_of(p, last, std::begin(sep), std::end(sep));
            q = std::find_if(p, last, [this](auto c) { return std::find(std::begin(sep), std::end(sep), c) != std::end(sep); });

            //q = std::search(p, last, std::begin(sep), std::end(sep));

            // workaround for lack of iterator variant of stringview
            if constexpr (std::is_same_v<S, std::string_view>) {
                return S(&*p, q-p);
            }
            else {
                return S(p, q);
            }
        }